

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReparserTester.cpp
# Opt level: O0

void __thiscall
psy::C::ReparserTester::reparse_withSyntaxCorrelation
          (ReparserTester *this,string *text,Expectation *X)

{
  InternalsTestSuite *this_00;
  Expectation local_f8;
  string local_40;
  Expectation *local_20;
  Expectation *X_local;
  string *text_local;
  ReparserTester *this_local;
  
  this_00 = (InternalsTestSuite *)(this->super_Tester).suite_;
  local_20 = X;
  X_local = (Expectation *)text;
  text_local = (string *)this;
  std::__cxx11::string::string((string *)&local_40,(string *)text);
  Expectation::Expectation(&local_f8,X);
  InternalsTestSuite::reparse_withSyntaxCorrelation(this_00,&local_40,&local_f8);
  Expectation::~Expectation(&local_f8);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void ReparserTester::reparse_withSyntaxCorrelation(std::string text, Expectation X)
{
    (static_cast<InternalsTestSuite*>(suite_)->reparse_withSyntaxCorrelation(text, X));
}